

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.c
# Opt level: O2

int yaml_emitter_flush(yaml_emitter_t *emitter)

{
  uchar **ppuVar1;
  byte bVar2;
  yaml_encoding_t yVar3;
  yaml_write_handler_t *pyVar4;
  yaml_char_t *pyVar5;
  uchar *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  uchar uVar13;
  byte *pbVar14;
  char *__assertion;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assertion = "emitter";
    uVar11 = 0x24;
  }
  else {
    pyVar4 = emitter->write_handler;
    if (pyVar4 == (yaml_write_handler_t *)0x0) {
      __assertion = "emitter->write_handler";
      uVar11 = 0x25;
    }
    else {
      yVar3 = emitter->encoding;
      if (yVar3 != YAML_ANY_ENCODING) {
        pbVar14 = (emitter->buffer).start;
        pbVar12 = (emitter->buffer).pointer;
        (emitter->buffer).last = pbVar12;
        (emitter->buffer).pointer = pbVar14;
        iVar7 = 1;
        if (pbVar14 != pbVar12) {
          if (yVar3 == YAML_UTF8_ENCODING) {
            iVar7 = (*pyVar4)(emitter->write_handler_data,pbVar14,(long)pbVar12 - (long)pbVar14);
            if (iVar7 != 0) {
              pyVar5 = (emitter->buffer).start;
              (emitter->buffer).last = pyVar5;
              (emitter->buffer).pointer = pyVar5;
              return 1;
            }
          }
          else {
            uVar8 = (ulong)(yVar3 != YAML_UTF16LE_ENCODING);
            uVar9 = (ulong)(yVar3 == YAML_UTF16LE_ENCODING);
            while (pbVar14 != pbVar12) {
              bVar2 = *pbVar14;
              uVar11 = (uint)bVar2;
              lVar15 = 1;
              if ((char)bVar2 < '\0') {
                uVar10 = (uint)bVar2;
                if ((uVar10 & 0xffffffe0) == 0xc0) {
                  uVar11 = bVar2 & 0x1f;
                  lVar15 = 2;
                }
                else {
                  lVar15 = (ulong)((uVar10 & 0xfffffff8) == 0xf0) << 2;
                  if ((uVar10 & 0xfffffff0) == 0xe0) {
                    uVar11 = bVar2 & 0xf;
                    lVar15 = 3;
                  }
                  else {
                    uVar11 = uVar10 & 7;
                    if ((uVar10 & 0xfffffff8) != 0xf0) {
                      uVar11 = 0;
                    }
                  }
                }
              }
              uVar10 = (uint)lVar15;
              if (((1 < uVar10) && (uVar11 = pbVar14[1] & 0x3f | uVar11 << 6, uVar10 != 2)) &&
                 (uVar11 = pbVar14[2] & 0x3f | uVar11 << 6, 3 < uVar10)) {
                uVar11 = uVar11 << 6 | pbVar14[3] & 0x3f;
              }
              (emitter->buffer).pointer = pbVar14 + lVar15;
              uVar13 = (uchar)(uVar11 >> 8);
              lVar15 = 2;
              uVar16 = uVar9;
              uVar17 = uVar8;
              if (0xffff < uVar11) {
                (emitter->raw_buffer).last[uVar9] = (char)(uVar11 - 0x10000 >> 0x12) + 0xd8;
                (emitter->raw_buffer).last[uVar8] = (uchar)(uVar11 - 0x10000 >> 10);
                uVar13 = uVar13 + 0xdc;
                lVar15 = 4;
                uVar16 = uVar8 ^ 3;
                uVar17 = uVar8 + 2;
              }
              (emitter->raw_buffer).last[uVar16] = uVar13;
              (emitter->raw_buffer).last[uVar17] = (uchar)uVar11;
              ppuVar1 = &(emitter->raw_buffer).last;
              *ppuVar1 = *ppuVar1 + lVar15;
              pbVar12 = (emitter->buffer).last;
              pbVar14 = (emitter->buffer).pointer;
            }
            puVar6 = (emitter->raw_buffer).start;
            iVar7 = (*emitter->write_handler)
                              (emitter->write_handler_data,puVar6,
                               (long)(emitter->raw_buffer).last - (long)puVar6);
            if (iVar7 != 0) {
              pyVar5 = (emitter->buffer).start;
              puVar6 = (emitter->raw_buffer).start;
              (emitter->buffer).last = pyVar5;
              (emitter->buffer).pointer = pyVar5;
              (emitter->raw_buffer).last = puVar6;
              (emitter->raw_buffer).pointer = puVar6;
              return 1;
            }
          }
          emitter->error = YAML_WRITER_ERROR;
          emitter->problem = "write error";
          iVar7 = 0;
        }
        return iVar7;
      }
      __assertion = "emitter->encoding";
      uVar11 = 0x26;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yaml/src/writer.c"
                ,uVar11,"int yaml_emitter_flush(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_flush(yaml_emitter_t *emitter)
{
    int low, high;

    assert(emitter);    /* Non-NULL emitter object is expected. */
    assert(emitter->write_handler); /* Write handler must be set. */
    assert(emitter->encoding);  /* Output encoding must be set. */

    emitter->buffer.last = emitter->buffer.pointer;
    emitter->buffer.pointer = emitter->buffer.start;

    /* Check if the buffer is empty. */

    if (emitter->buffer.start == emitter->buffer.last) {
        return 1;
    }

    /* If the output encoding is UTF-8, we don't need to recode the buffer. */

    if (emitter->encoding == YAML_UTF8_ENCODING)
    {
        if (emitter->write_handler(emitter->write_handler_data,
                    emitter->buffer.start,
                    emitter->buffer.last - emitter->buffer.start)) {
            emitter->buffer.last = emitter->buffer.start;
            emitter->buffer.pointer = emitter->buffer.start;
            return 1;
        }
        else {
            return yaml_emitter_set_writer_error(emitter, "write error");
        }
    }

    /* Recode the buffer into the raw buffer. */

    low = (emitter->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
    high = (emitter->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

    while (emitter->buffer.pointer != emitter->buffer.last)
    {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        /* 
         * See the "reader.c" code for more details on UTF-8 encoding.  Note
         * that we assume that the buffer contains a valid UTF-8 sequence.
         */

        /* Read the next UTF-8 character. */

        octet = emitter->buffer.pointer[0];

        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;

        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

        for (k = 1; k < width; k ++) {
            octet = emitter->buffer.pointer[k];
            value = (value << 6) + (octet & 0x3F);
        }

        emitter->buffer.pointer += width;

        /* Write the character. */

        if (value < 0x10000)
        {
            emitter->raw_buffer.last[high] = value >> 8;
            emitter->raw_buffer.last[low] = value & 0xFF;

            emitter->raw_buffer.last += 2;
        }
        else
        {
            /* Write the character using a surrogate pair (check "reader.c"). */

            value -= 0x10000;
            emitter->raw_buffer.last[high] = 0xD8 + (value >> 18);
            emitter->raw_buffer.last[low] = (value >> 10) & 0xFF;
            emitter->raw_buffer.last[high+2] = 0xDC + ((value >> 8) & 0xFF);
            emitter->raw_buffer.last[low+2] = value & 0xFF;

            emitter->raw_buffer.last += 4;
        }
    }

    /* Write the raw buffer. */

    if (emitter->write_handler(emitter->write_handler_data,
                emitter->raw_buffer.start,
                emitter->raw_buffer.last - emitter->raw_buffer.start)) {
        emitter->buffer.last = emitter->buffer.start;
        emitter->buffer.pointer = emitter->buffer.start;
        emitter->raw_buffer.last = emitter->raw_buffer.start;
        emitter->raw_buffer.pointer = emitter->raw_buffer.start;
        return 1;
    }
    else {
        return yaml_emitter_set_writer_error(emitter, "write error");
    }
}